

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O3

uint64 mkvmuxer::MakeUID(uint *seed)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  
  iVar3 = 7;
  uVar2 = 0;
  do {
    uVar1 = rand_r(seed);
    uVar2 = (ulong)(uVar1 >> 4 & 0xff) | uVar2 << 8;
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  return uVar2;
}

Assistant:

uint64 MakeUID(unsigned int* seed) {
  uint64 uid = 0;

  for (int i = 0; i < 7; ++i) {  // avoid problems with 8-byte values
    uid <<= 8;

// TODO(fgalligan): Move random number generation to platform specific code.
#ifdef _WIN32
    (void)seed;
    const int32 nn = rand();
#elif defined(__ANDROID__)
    (void)seed;
    int32 temp_num = 1;
    int fd = open("/dev/urandom", O_RDONLY);
    if (fd != -1) {
      read(fd, &temp_num, sizeof(temp_num));
      close(fd);
    }
    const int32 nn = temp_num;
#else
    const int32 nn = rand_r(seed);
#endif
    const int32 n = 0xFF & (nn >> 4);  // throw away low-order bits

    uid |= n;
  }

  return uid;
}